

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O2

HTTPAPI_RESULT HTTPAPI_SetOption(HTTP_HANDLE handle,char *optionName,void *value)

{
  char *__s;
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *dst;
  HTTPAPI_RESULT HVar6;
  char *pcVar7;
  char proxy [65];
  
  if ((optionName == (char *)0x0 || handle == (HTTP_HANDLE)0x0) || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    HVar6 = HTTPAPI_INVALID_ARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    pcVar7 = "invalid parameter (NULL) passed to HTTPAPI_SetOption";
    iVar1 = 0x385;
  }
  else {
    iVar1 = strcmp("timeout",optionName);
    if (iVar1 == 0) {
      handle->timeout = (ulong)*value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("CURLOPT_LOW_SPEED_LIMIT",optionName);
    if (iVar1 == 0) {
      handle->lowSpeedLimit = *value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("CURLOPT_LOW_SPEED_TIME",optionName);
    if (iVar1 == 0) {
      handle->lowSpeedTime = *value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("CURLOPT_FRESH_CONNECT",optionName);
    if (iVar1 == 0) {
      handle->freshConnect = *value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("CURLOPT_FORBID_REUSE",optionName);
    if (iVar1 == 0) {
      handle->forbidReuse = *value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("CURLOPT_VERBOSE",optionName);
    if (iVar1 == 0) {
      handle->verbose = *value;
      return HTTPAPI_OK;
    }
    iVar1 = strcmp("x509PrivatekeyType",optionName);
    if (iVar1 == 0) {
      if (*value < 2) {
        handle->x509privatekeytype = *value;
        return HTTPAPI_OK;
      }
      p_Var2 = xlogging_get_log_function();
      HVar6 = HTTPAPI_ERROR;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      pcVar7 = "Unknown x509PrivatekeyType: %i";
      iVar1 = 0x3b4;
      goto LAB_00165c42;
    }
    iVar1 = strcmp("Engine",optionName);
    if (iVar1 == 0) {
      iVar1 = mallocAndStrcpy_s(&handle->engineId,(char *)value);
      if (iVar1 == 0) {
        return HTTPAPI_OK;
      }
      p_Var2 = xlogging_get_log_function();
      HVar6 = HTTPAPI_ERROR;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      pcVar7 = "unable to mallocAndStrcpy_s x509PrivatekeyType";
      iVar1 = 0x3bd;
      goto LAB_00165c42;
    }
    iVar1 = strcmp("x509privatekey",optionName);
    if ((iVar1 == 0) || (iVar1 = strcmp("x509EccAliasKey",optionName), iVar1 == 0)) {
      handle->x509privatekey = (char *)value;
      if (handle->x509certificate == (char *)0x0) {
        return HTTPAPI_OK;
      }
      iVar1 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(handle->curl,0x277d,handle);
        if (iVar1 == 0) {
          return HTTPAPI_OK;
        }
        p_Var2 = xlogging_get_log_function();
        HVar6 = HTTPAPI_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return HTTPAPI_ERROR;
        }
        pcVar7 = "unable to curl_easy_setopt";
        iVar1 = 0x3d5;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        HVar6 = HTTPAPI_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return HTTPAPI_ERROR;
        }
        pcVar7 = "unable to curl_easy_setopt";
        iVar1 = 0x3ce;
      }
      goto LAB_00165c42;
    }
    iVar1 = strcmp("x509certificate",optionName);
    if ((iVar1 == 0) || (iVar1 = strcmp("x509EccCertificate",optionName), iVar1 == 0)) {
      handle->x509certificate = (char *)value;
      if (handle->x509privatekey == (char *)0x0) {
        return HTTPAPI_OK;
      }
      iVar1 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(handle->curl,0x277d,handle);
        if (iVar1 == 0) {
          return HTTPAPI_OK;
        }
        p_Var2 = xlogging_get_log_function();
        HVar6 = HTTPAPI_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return HTTPAPI_ERROR;
        }
        pcVar7 = "unable to curl_easy_setopt";
        iVar1 = 0x3f2;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        HVar6 = HTTPAPI_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return HTTPAPI_ERROR;
        }
        pcVar7 = "unable to curl_easy_setopt";
        iVar1 = 0x3eb;
      }
      goto LAB_00165c42;
    }
    iVar1 = strcmp("proxy_data",optionName);
    if (iVar1 != 0) {
      iVar1 = strcmp("TrustedCerts",optionName);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(handle->curl,0x277d,handle);
          if (iVar1 == 0) {
            handle->certificates = (char *)value;
            return HTTPAPI_OK;
          }
          p_Var2 = xlogging_get_log_function();
          HVar6 = HTTPAPI_ERROR;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return HTTPAPI_ERROR;
          }
          pcVar7 = "failure in curl_easy_setopt - CURLOPT_SSL_CTX_DATA";
          iVar1 = 0x454;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          HVar6 = HTTPAPI_ERROR;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return HTTPAPI_ERROR;
          }
          pcVar7 = "failure in curl_easy_setopt - CURLOPT_SSL_CTX_FUNCTION";
          iVar1 = 0x44d;
        }
      }
      else {
        iVar1 = strcmp("CURLOPT_INTERFACE",optionName);
        if (iVar1 == 0) {
          if (*value == '\0') {
            p_Var2 = xlogging_get_log_function();
            HVar6 = HTTPAPI_ERROR;
            if (p_Var2 == (LOGGER_LOG)0x0) {
              return HTTPAPI_ERROR;
            }
            pcVar7 = 
            "unable to curl_easy_setopt for CURLOPT_INTERFACE option as option-value is invalid/empty"
            ;
            iVar1 = 0x46f;
          }
          else {
            iVar1 = curl_easy_setopt(handle->curl,0x274e,value);
            if (iVar1 == 0) {
              return HTTPAPI_OK;
            }
            p_Var2 = xlogging_get_log_function();
            HVar6 = HTTPAPI_ERROR;
            if (p_Var2 == (LOGGER_LOG)0x0) {
              return HTTPAPI_ERROR;
            }
            pcVar7 = "unable to curl_easy_setopt for CURLOPT_INTERFACE";
            iVar1 = 0x465;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          HVar6 = HTTPAPI_INVALID_ARG;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return HTTPAPI_INVALID_ARG;
          }
          pcVar7 = "unknown option %s";
          iVar1 = 0x476;
        }
      }
      goto LAB_00165c42;
    }
    iVar1 = sprintf_s(proxy,0x41,"%s:%d",*value,(ulong)*(uint *)((long)value + 8));
    if (iVar1 < 1) {
      p_Var2 = xlogging_get_log_function();
      HVar6 = HTTPAPI_ERROR;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      pcVar7 = "failure constructing proxy address";
      iVar1 = 0x40a;
      goto LAB_00165c42;
    }
    iVar1 = curl_easy_setopt(handle->curl,0x2714,proxy);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      HVar6 = HTTPAPI_ERROR;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      pcVar7 = "failure setting curl proxy address";
      iVar1 = 0x411;
      goto LAB_00165c42;
    }
    pcVar7 = *(char **)((long)value + 0x10);
    if (pcVar7 == (char *)0x0) {
      return HTTPAPI_OK;
    }
    __s = *(char **)((long)value + 0x18);
    if (__s == (char *)0x0) {
      return HTTPAPI_OK;
    }
    sVar3 = strlen(pcVar7);
    sVar4 = strlen(__s);
    uVar5 = sVar4 + sVar3;
    if (CARRY8(sVar4,sVar3)) {
      uVar5 = 0xffffffffffffffff;
    }
    sVar3 = uVar5 + 2;
    if (0xfffffffffffffffd < uVar5) {
      sVar3 = 0xffffffffffffffff;
    }
    if (sVar3 == 0xffffffffffffffff) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/httpapi_curl.c"
                  ,"HTTPAPI_SetOption",0x41c,1,"Invalid malloc size");
      }
    }
    else {
      dst = (char *)malloc(sVar3);
      if (dst != (char *)0x0) {
        iVar1 = sprintf_s(dst,0x41,"%s:%s",pcVar7,__s);
        if (iVar1 < 1) {
          p_Var2 = xlogging_get_log_function();
          HVar6 = HTTPAPI_ERROR;
          if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001663be;
          pcVar7 = "failure constructing proxy authentication";
          iVar1 = 0x42e;
        }
        else {
          iVar1 = curl_easy_setopt(handle->curl,0x2716,dst);
          if (iVar1 == 0) {
            HVar6 = HTTPAPI_OK;
            goto LAB_001663be;
          }
          p_Var2 = xlogging_get_log_function();
          HVar6 = HTTPAPI_ERROR;
          if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001663be;
          pcVar7 = "failure setting curl proxy authentication";
          iVar1 = 0x435;
        }
        HVar6 = HTTPAPI_ERROR;
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/httpapi_curl.c"
                  ,"HTTPAPI_SetOption",iVar1,1,pcVar7);
LAB_001663be:
        free(dst);
        return HVar6;
      }
    }
    p_Var2 = xlogging_get_log_function();
    HVar6 = HTTPAPI_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTPAPI_ERROR;
    }
    pcVar7 = "failure allocating proxy authentication";
    iVar1 = 0x426;
  }
LAB_00165c42:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/httpapi_curl.c"
            ,"HTTPAPI_SetOption",iVar1,1,pcVar7);
  return HVar6;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_SetOption(HTTP_HANDLE handle, const char* optionName, const void* value)
{
    HTTPAPI_RESULT result;
    if (
        (handle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to HTTPAPI_SetOption");
    }
    else
    {
        HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
        if (strcmp(OPTION_HTTP_TIMEOUT, optionName) == 0)
        {
            long timeout = (long)(*(unsigned int*)value);
            httpHandleData->timeout = timeout;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_LOW_SPEED_LIMIT, optionName) == 0)
        {
            httpHandleData->lowSpeedLimit = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_LOW_SPEED_TIME, optionName) == 0)
        {
            httpHandleData->lowSpeedTime = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_FRESH_CONNECT, optionName) == 0)
        {
            httpHandleData->freshConnect = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_FORBID_REUSE, optionName) == 0)
        {
            httpHandleData->forbidReuse = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_VERBOSE, optionName) == 0)
        {
            httpHandleData->verbose = *(const long*)value;
            result = HTTPAPI_OK;
        }
#ifdef USE_OPENSSL
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            if (type == KEY_TYPE_DEFAULT || type == KEY_TYPE_ENGINE)
            {
                httpHandleData->x509privatekeytype = type;
                result = HTTPAPI_OK;
            }
            else
            {
                LogError("Unknown x509PrivatekeyType: %i", type);
                result = HTTPAPI_ERROR;
            }
        }
#ifndef OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)&httpHandleData->engineId, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509PrivatekeyType");
                result = HTTPAPI_ERROR;
            }
            else
            {
                result = HTTPAPI_OK;
            }
        }
#endif // OPENSSL_NO_ENGINE
#endif
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            httpHandleData->x509privatekey = value;
            if (httpHandleData->x509certificate != NULL)
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                    {
                        LogError("unable to curl_easy_setopt");
                        result = HTTPAPI_ERROR;
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
            else
            {
                /*if privatekey comes 1st and certificate is not set yet, then return OK and wait for the certificate to be set*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            httpHandleData->x509certificate = value;
            if (httpHandleData->x509privatekey != NULL)
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                    {
                        LogError("unable to curl_easy_setopt");
                        result = HTTPAPI_ERROR;
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
            else
            {
                /*if certificate comes 1st and private key is not set yet, then return OK and wait for the private key to be set*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, optionName) == 0)
        {
            char proxy[MAX_HOSTNAME_LEN];
            char* proxy_auth;

            HTTP_PROXY_OPTIONS* proxy_data = (HTTP_PROXY_OPTIONS*)value;

            if (sprintf_s(proxy, MAX_HOSTNAME_LEN, "%s:%d", proxy_data->host_address, proxy_data->port) <= 0)
            {
                LogError("failure constructing proxy address");
                result = HTTPAPI_ERROR;
            }
            else
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_PROXY, proxy) != CURLE_OK)
                {
                    LogError("failure setting curl proxy address");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (proxy_data->username != NULL && proxy_data->password != NULL)
                    {
                        size_t authLen = safe_add_size_t(strlen(proxy_data->username), strlen(proxy_data->password));
                        authLen = safe_add_size_t(authLen, 2);
                        if (authLen == SIZE_MAX)
                        {
                            LogError("Invalid malloc size");
                            proxy_auth = NULL;
                        }
                        else
                        {
                            proxy_auth = malloc(authLen);
                        }

                        if (proxy_auth == NULL)
                        {
                            LogError("failure allocating proxy authentication");
                            result = HTTPAPI_ERROR;
                        }
                        else
                        {
                            // From curl website 'Pass a char * as parameter, which should be [user name]:[password]'
                            if (sprintf_s(proxy_auth, MAX_HOSTNAME_LEN, "%s:%s", proxy_data->username, proxy_data->password) <= 0)
                            {
                                LogError("failure constructing proxy authentication");
                                result = HTTPAPI_ERROR;
                            }
                            else
                            {
                                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_PROXYUSERPWD, proxy_auth) != CURLE_OK)
                                {
                                    LogError("failure setting curl proxy authentication");
                                    result = HTTPAPI_ERROR;
                                }
                                else
                                {
                                    result = HTTPAPI_OK;
                                }
                            }
                            free(proxy_auth);
                            proxy_auth = NULL;
                        }
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
        }
        else if (strcmp("TrustedCerts", optionName) == 0)
        {
            /*TrustedCerts needs to trigger the CURLOPT_SSL_CTX_FUNCTION in curl so we can pass the CAs*/
            if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
            {
                LogError("failure in curl_easy_setopt - CURLOPT_SSL_CTX_FUNCTION");
                result = HTTPAPI_ERROR;
            }
            else
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                {
                    LogError("failure in curl_easy_setopt - CURLOPT_SSL_CTX_DATA");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    httpHandleData->certificates = (const char*)value;
                    result = HTTPAPI_OK;
                }
            }
        }
        else if (strcmp(OPTION_CURL_INTERFACE, optionName) == 0)
        {
            const char *interfaceName = (const char*)value;
            if (interfaceName != NULL && interfaceName[0] != '\0')
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_INTERFACE, interfaceName) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt for CURLOPT_INTERFACE");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    result = HTTPAPI_OK;
                }
            }
            else
            {
                LogError("unable to curl_easy_setopt for CURLOPT_INTERFACE option as option-value is invalid/empty");
                result = HTTPAPI_ERROR;
            }
        }
        else
        {
            result = HTTPAPI_INVALID_ARG;
            LogError("unknown option %s", optionName);
        }
    }

    return result;
}